

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

WrapPoint Big5WrapPoint(tchar c)

{
  undefined4 local_c;
  tchar c_local;
  
  if ((c & 0xff00) == 0xa100) {
    if (((c < 0xa15d) || (0xa1ac < c)) || ((c & 1) != 1)) {
      local_c = WrapAfter;
    }
    else {
      local_c = WrapBefore;
    }
  }
  else {
    local_c = NoWrapPoint;
  }
  return local_c;
}

Assistant:

static WrapPoint Big5WrapPoint(tchar c)
{
    if ((c & 0xFF00) == 0xA100)
    { 
        /* opening brackets have odd codes: break before them */ 
        if ( c > 0xA15C && c < 0xA1AD && (c & 1) == 1 ) 
            return WrapBefore;
        return WrapAfter;
    }
    return NoWrapPoint;
}